

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::OnMemoryDropExpr(Validator *this,MemoryDropExpr *expr)

{
  char *pcVar1;
  int __c;
  Var *var;
  Opcode local_24;
  MemoryDropExpr *local_20;
  MemoryDropExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)24>).super_Expr.loc;
  local_20 = expr;
  expr_local = (MemoryDropExpr *)this;
  Opcode::Opcode(&local_24,MemoryDrop);
  CheckHasMemory(this,&(expr->super_ExprMixin<(wabt::ExprType)24>).super_Expr.loc,local_24);
  var = &local_20->var;
  CheckDataSegmentVar(this,var);
  pcVar1 = Var::index(&local_20->var,(char *)var,__c);
  TypeChecker::OnMemoryDrop(&this->typechecker_,(uint32_t)pcVar1);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnMemoryDropExpr(MemoryDropExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckHasMemory(&expr->loc, Opcode::MemoryDrop);
  CheckDataSegmentVar(&expr->var);
  typechecker_.OnMemoryDrop(expr->var.index());
  return Result::Ok;
}